

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicList::Builder::copyFrom
          (Builder *this,initializer_list<capnp::DynamicValue::Reader> value)

{
  bool bVar1;
  undefined1 local_d8 [8];
  Reader element;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<capnp::DynamicValue::Reader> *__range1;
  uint i;
  Fault local_68;
  Fault f;
  size_type local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  Builder *this_local;
  initializer_list<capnp::DynamicValue::Reader> value_local;
  
  value_local._M_array = (iterator)value._M_len;
  this_local = (Builder *)value._M_array;
  _kjCondition._32_8_ = this;
  local_58 = std::initializer_list<capnp::DynamicValue::Reader>::size
                       ((initializer_list<capnp::DynamicValue::Reader> *)&this_local);
  local_50 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception._4_4_ = size(this);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_int> *)local_48,&local_50,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,char_const(&)[53]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x58b,FAILED,"value.size() == size()",
               "_kjCondition,\"DynamicList::copyFrom() argument had different size.\"",
               (DebugComparison<unsigned_long,_unsigned_int> *)local_48,
               (char (*) [53])"DynamicList::copyFrom() argument had different size.");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  __range1._0_4_ = 0;
  __end1 = std::initializer_list<capnp::DynamicValue::Reader>::begin
                     ((initializer_list<capnp::DynamicValue::Reader> *)&this_local);
  element.field_1._56_8_ =
       std::initializer_list<capnp::DynamicValue::Reader>::end
                 ((initializer_list<capnp::DynamicValue::Reader> *)&this_local);
  for (; __end1 != element.field_1._56_8_; __end1 = __end1 + 1) {
    DynamicValue::Reader::Reader((Reader *)local_d8,__end1);
    set(this,(uint)__range1,(Reader *)local_d8);
    DynamicValue::Reader::~Reader((Reader *)local_d8);
    __range1._0_4_ = (uint)__range1 + 1;
  }
  return;
}

Assistant:

void DynamicList::Builder::copyFrom(std::initializer_list<DynamicValue::Reader> value) {
  KJ_REQUIRE(value.size() == size(), "DynamicList::copyFrom() argument had different size.");
  uint i = 0;
  for (auto element: value) {
    set(i++, element);
  }
}